

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeView::drawRow(QTreeView *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
                  )

{
  bool bVar1;
  bool bVar2;
  QTreeViewPrivate *this_00;
  QPoint QVar3;
  QHeaderView *this_01;
  Data *pDVar4;
  QAbstractItemModel *pQVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  undefined1 *puVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  int *piVar12;
  bool bVar13;
  bool bVar14;
  char cVar15;
  byte bVar16;
  bool bVar17;
  Representation RVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  SelectionBehavior SVar23;
  Representation RVar24;
  Representation RVar25;
  uint uVar26;
  uint uVar27;
  LayoutDirection LVar28;
  QWidget *pQVar29;
  QWidget *pQVar30;
  ulong uVar31;
  QStyle *pQVar32;
  long *plVar33;
  QColor *pQVar34;
  QWidget *pQVar35;
  int c_1;
  int c_2;
  QAbstractItemModel *pQVar36;
  int c;
  int iVar37;
  long in_FS_OFFSET;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  Representation local_250;
  QRect local_248;
  QRect local_238;
  QRect local_228;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> local_218;
  undefined8 local_1f8;
  int *piStack_1f0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1e8;
  undefined8 local_1d8;
  int *piStack_1d0;
  QAbstractItemModel *pQStack_1c8;
  undefined8 local_1b8;
  int *piStack_1b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1a8;
  undefined8 local_198;
  int *piStack_190;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_188;
  undefined1 *local_178;
  undefined1 *puStack_170;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_168;
  undefined1 local_158 [12];
  Representation RStack_14c;
  undefined1 local_148 [16];
  undefined1 *local_138;
  QPalettePrivate *pQStack_130;
  undefined1 *local_128;
  QObject *pQStack_120;
  QColor local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [12];
  Representation RStack_ec;
  ColorGroup local_d8;
  bool local_a0;
  QFlagsStorage<QStyleOptionViewItem::ViewItemFeature> local_9c;
  ViewItemPosition local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  memset((QStyleOptionViewItem *)local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_108,option);
  QVar3 = (this_00->super_QAbstractItemViewPrivate).scrollDelayOffset;
  RVar18.m_i = QVar3.yp.m_i.m_i + (option->super_QStyleOption).rect.y1.m_i;
  local_168.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_170 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_178,index);
  this_01 = this_00->header;
  local_188.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_198 = &DAT_aaaaaaaaaaaaaaaa;
  piStack_190 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_198,(QAbstractItemView *)this);
  local_1a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
  piStack_1b0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_1b8,&(this_00->super_QAbstractItemViewPrivate).hover);
  bVar13 = QWidget::isRightToLeft((QWidget *)this);
  uVar9 = local_108._8_4_;
  bVar17 = this_00->spanning;
  if (bVar17 == true) {
    iVar19 = QHeaderView::visualIndex(this_01,0);
    iVar20 = QHeaderView::visualIndex(this_01,0);
  }
  else {
    iVar19 = (this_00->leftAndRight).first;
    iVar20 = (this_00->leftAndRight).second;
  }
  puVar8 = local_198;
  bVar1 = (this_00->super_QAbstractItemViewPrivate).alternatingColors;
  bVar2 = this_00->allColumnsShowFocus;
  if (((int)local_198 == index->r) &&
     (pDVar4 = (this_00->super_QAbstractItemViewPrivate).editorIndexHash.d, pDVar4 != (Data *)0x0))
  {
    bVar7 = false;
    if (pDVar4->size != 0) {
      pQVar29 = QApplication::focusWidget();
      for (iVar37 = 0; iVar21 = QHeaderView::count(this_01), iVar37 < iVar21; iVar37 = iVar37 + 1) {
        local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        stack0xfffffffffffffeb0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar36 = (this_00->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar36 + 0x60))
                  ((QModelIndex *)local_158,pQVar36,(ulong)puVar8 & 0xffffffff,iVar37,&local_178);
        pQVar30 = QAbstractItemView::indexWidget((QAbstractItemView *)this,(QModelIndex *)local_158)
        ;
        pQVar35 = pQVar29;
        if (pQVar30 != (QWidget *)0x0) {
          for (; (pQVar35 != pQVar30 && (pQVar35 != (QWidget *)0x0));
              pQVar35 = *(QWidget **)(*(long *)&pQVar35->field_0x8 + 0x10)) {
          }
          if (pQVar35 != (QWidget *)0x0) {
            bVar7 = true;
            goto LAB_00542a3a;
          }
        }
      }
      bVar7 = false;
    }
  }
  else {
    bVar7 = false;
  }
LAB_00542a3a:
  bVar14 = QWidget::hasFocus((QWidget *)this);
  if ((bVar14 & bVar2) == 1) {
    bVar38 = false;
    if (((-1 < (int)local_198) && (-1 < (long)local_198)) &&
       (local_188.ptr != (QAbstractItemModel *)0x0)) {
      iVar37 = index->r;
      iVar21 = 0;
      bVar38 = false;
      while ((iVar21 < iVar19 && (!bVar38))) {
        local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_158._0_4_ = -0x55555556;
        local_158._4_4_ = -0x55555556;
        stack0xfffffffffffffeb0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar36 = (this_00->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar36 + 0x60))(local_158,pQVar36,iVar37,iVar21,&local_178);
        if ((local_158._0_4_ == (int)local_198) &&
           ((local_158._4_4_ == local_198._4_4_ && (stack0xfffffffffffffeb0 == piStack_190)))) {
          bVar38 = (QAbstractItemModel *)local_148._0_8_ == local_188.ptr;
        }
        else {
          bVar38 = false;
        }
        iVar21 = iVar21 + 1;
      }
      local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xfffffffffffffeb0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar36 = (this_00->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar36 + 0x68))(local_158,pQVar36,index);
      iVar21 = iVar20;
      while ((iVar22 = QHeaderView::count(this_01), iVar21 < iVar22 && (!bVar38))) {
        pQVar36 = (this_00->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar36 + 0x60))(&local_1d8,pQVar36,iVar37,iVar21,local_158);
        if ((int)local_1d8 == (int)local_198) {
          if ((local_1d8._4_4_ != local_198._4_4_) || (piStack_1d0 != piStack_190))
          goto LAB_00542c2e;
          bVar38 = pQStack_1c8 == local_188.ptr;
        }
        else {
LAB_00542c2e:
          bVar38 = false;
        }
        iVar21 = iVar21 + 1;
      }
    }
  }
  else {
    bVar38 = false;
  }
  if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior & SelectRows) == SelectItems) {
    local_a0 = SUB41(*(undefined4 *)&option->showDecorationSelected,0);
  }
  else {
    local_a0 = true;
  }
  iVar37 = (option->super_QStyleOption).rect.y2.m_i;
  iVar21 = (option->super_QStyleOption).rect.y1.m_i;
  local_1d8 = (undefined1 *)0xffffffffffffffff;
  piStack_1d0 = (int *)0x0;
  pQStack_1c8 = (QAbstractItemModel *)0x0;
  SVar23 = QAbstractItemView::selectionBehavior((QAbstractItemView *)this);
  bVar39 = false;
  if (SVar23 == SelectRows) {
    QModelIndex::parent((QModelIndex *)local_158,index);
    QModelIndex::parent((QModelIndex *)&local_1f8,(QModelIndex *)&local_1b8);
    if (local_158._0_4_ == (int)local_1f8) {
      if (((local_158._4_4_ == local_1f8._4_4_) && (stack0xfffffffffffffeb0 == piStack_1f0)) &&
         ((QAbstractItemModel *)local_148._0_8_ == local_1e8.ptr)) {
        bVar39 = index->r == (int)local_1b8;
      }
      else {
        bVar39 = false;
      }
    }
    else {
      bVar39 = false;
    }
  }
  local_1f8 = (Data *)0x0;
  piStack_1f0 = (int *)0x0;
  local_1e8.ptr = (QAbstractItemModel *)0x0;
  local_218.d = (Data *)0x0;
  local_218.ptr = (ViewItemPosition *)0x0;
  local_218.size = 0;
  QTreeViewPrivate::calcLogicalIndices
            (this_00,(QList<int> *)&local_1f8,
             (QList<QStyleOptionViewItem::ViewItemPosition> *)&local_218,iVar19,iVar20);
  RVar24.m_i = RVar18.m_i + (iVar37 - iVar21);
  for (pQVar36 = (QAbstractItemModel *)0x0; pQVar36 < local_1e8.ptr; pQVar36 = pQVar36 + 1) {
    iVar19 = piStack_1f0[(long)pQVar36];
    iVar20 = columnViewportPosition(this,iVar19);
    local_250 = QVar3.xp.m_i;
    RVar25.m_i = iVar20 + local_250.m_i;
    iVar20 = QHeaderView::sectionSize(this_01,iVar19);
    if (bVar17 != false) {
      iVar37 = QHeaderView::count(this_01);
      iVar37 = QHeaderView::logicalIndex(this_01,iVar37 + -1);
      iVar21 = columnViewportPosition(this,iVar37);
      if (bVar13) {
        iVar20 = (iVar20 + RVar25.m_i) - iVar21;
        RVar25.m_i = columnViewportPosition(this,iVar37);
      }
      else {
        iVar20 = QHeaderView::sectionSize(this_01,iVar37);
        iVar20 = (iVar21 - RVar25.m_i) + iVar20;
      }
    }
    pQVar5 = (this_00->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar5 + 0x60))(local_158,pQVar5,index->r,iVar19);
    pQStack_1c8 = (QAbstractItemModel *)local_148._0_8_;
    local_1d8 = (undefined1 *)local_158._0_8_;
    puVar8 = local_1d8;
    piStack_1d0 = stack0xfffffffffffffeb0;
    local_1d8._0_4_ = (int)local_158._0_8_;
    bVar40 = -1 < (int)local_1d8;
    local_1d8 = puVar8;
    if (((bVar40) && (-1 < (long)local_158._0_8_)) &&
       ((QAbstractItemModel *)local_148._0_8_ != (QAbstractItemModel *)0x0)) {
      local_48 = local_218.ptr[(long)pQVar36];
      local_108._8_4_ = uVar9;
      if (bVar7) {
        local_108._8_4_ = uVar9 | 0x10000;
      }
      cVar15 = QItemSelectionModel::isSelected
                         ((QModelIndex *)
                          (this_00->super_QAbstractItemViewPrivate).selectionModel.wp.value);
      if (cVar15 != '\0') {
        local_108._8_4_ = local_108._8_4_ | 0x8000;
      }
      bVar40 = bVar38;
      if (((bVar14) && ((int)local_198 == (int)local_1d8)) &&
         ((local_198._4_4_ == local_1d8._4_4_ && (piStack_190 == piStack_1d0)))) {
        if (local_188.ptr == pQStack_1c8) {
          bVar40 = true;
        }
        if (local_188.ptr == pQStack_1c8 && (bVar2 & 1U) == 0) {
          local_108._8_4_ = local_108._8_4_ | 0x100;
          bVar40 = bVar38;
        }
      }
      if (((bVar39) ||
          (((((int)local_1d8 == (int)local_1b8 && (local_1d8._4_4_ == local_1b8._4_4_)) &&
            (piStack_1d0 == piStack_1b0)) && (pQStack_1c8 == local_1a8.ptr)))) &&
         ((option->showDecorationSelected != false || (this_00->hoverBranch == -1)))) {
        local_108._8_4_ = local_108._8_4_ | 0x2000;
      }
      else {
        local_108._8_4_ = local_108._8_4_ & 0xffffdfff;
      }
      if ((uVar9 & 1) != 0) {
        pQVar5 = (this_00->super_QAbstractItemViewPrivate).model;
        uVar31 = (**(code **)(*(long *)pQVar5 + 0x138))(pQVar5,&local_1d8);
        if ((uVar31 & 0x20) == 0) {
          local_108._8_4_ = local_108._8_4_ & 0xfffffffe;
          local_d8 = Disabled;
        }
        else {
          local_d8 = (uint)~local_108._8_4_ >> 0xf & Inactive;
        }
      }
      if (bVar1 != false) {
        local_9c.i = (local_9c.i & 0xfffffffd) + (this_00->current & 1U) * 2;
      }
      local_9c.i = local_9c.i & 0xffffffdf;
      iVar37 = QTreeViewPrivate::logicalIndexForTree(this_00);
      uVar10 = local_108._8_4_;
      if (iVar37 == iVar19) {
        uVar26 = QTreeViewPrivate::indentationForItem(this_00,this_00->current);
        local_158._0_4_ = (iVar20 + RVar25.m_i) - uVar26;
        if (!bVar13) {
          local_158._0_4_ = RVar25.m_i;
        }
        local_158._4_4_ = RVar18.m_i;
        stack0xfffffffffffffeb0 = (int *)CONCAT44(RVar24.m_i,(uVar26 - 1) + local_158._0_4_);
        if (iVar20 < (int)uVar26) {
          QPainter::save();
          local_228.x2.m_i = iVar20 + RVar25.m_i + -1;
          local_228.x1.m_i = RVar25.m_i;
          local_228.y1.m_i = RVar18.m_i;
          local_228.y2.m_i = RVar24.m_i;
          QPainter::setClipRect((QRect *)painter,(ClipOperation)&local_228);
        }
        bVar38 = local_a0;
        pQVar32 = QWidget::style((QWidget *)this);
        iVar19 = (**(code **)(*(long *)pQVar32 + 0xf0))(pQVar32,0x3c,local_108,this,0);
        local_a0 = iVar19 != 0;
        local_f8._0_8_ = local_158._0_8_;
        uVar11 = local_f8._0_8_;
        stack0xffffffffffffff10 = stack0xfffffffffffffeb0;
        piVar12 = stack0xffffffffffffff10;
        local_f8._8_4_ = SUB84(stack0xfffffffffffffeb0,0);
        local_f8._0_4_ = (undefined4)local_158._0_8_;
        if (0 < (local_f8._8_4_ - local_f8._0_4_) + 1) {
          local_9c.i = local_9c.i | 0x60;
          local_f8._0_8_ = uVar11;
          unique0x100011fc = piVar12;
          pQVar32 = QWidget::style((QWidget *)this);
          (**(code **)(*(long *)pQVar32 + 0xb0))(pQVar32,0x2d,local_108,painter,this);
          local_9c.i = local_9c.i & 0xffffffbf;
        }
        uVar10 = local_108._8_4_;
        local_108._8_4_ = local_108._8_4_ & 0xffff7fff;
        uVar27 = uVar26;
        if (bVar13) {
          uVar27 = 0;
        }
        local_f8._4_4_ = RVar18.m_i;
        local_f8._0_4_ = uVar27 + RVar25.m_i;
        RStack_ec.m_i = RVar24.m_i;
        local_f8._8_4_ = ~uVar26 + iVar20 + uVar27 + RVar25.m_i;
        pQVar32 = QWidget::style((QWidget *)this);
        (**(code **)(*(long *)pQVar32 + 0xb0))(pQVar32,0x2d,local_108,painter,this);
        local_108._8_4_ = uVar10;
        local_a0 = bVar38;
        if (this_00->indent != 0) {
          (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget + 0x308))(this,painter,local_158,index);
        }
        if (iVar20 < (int)uVar26) {
          QPainter::restore();
        }
      }
      else {
        local_108._8_4_ = local_108._8_4_ & 0xffff7fff;
        local_f8._4_4_ = RVar18.m_i;
        local_f8._0_4_ = RVar25.m_i;
        RStack_ec.m_i = RVar24.m_i;
        local_f8._8_4_ = iVar20 + -1 + RVar25.m_i;
        pQVar32 = QWidget::style((QWidget *)this);
        (**(code **)(*(long *)pQVar32 + 0xb0))(pQVar32,0x2d,local_108,painter,this);
        local_108._8_4_ = uVar10;
      }
      plVar33 = (long *)(**(code **)(*(long *)&(this->super_QAbstractItemView).
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget
                                    + 0x208))(this,&local_1d8);
      (**(code **)(*plVar33 + 0x60))(plVar33,painter,local_108,&local_1d8);
      bVar38 = bVar40;
    }
  }
  if (bVar38) {
    local_118._0_6_ = 0xaaaaaaaaaaaa;
    local_118.ct.argb.red = 0xaaaa;
    local_118.ct._4_6_ = 0xaaaaaaaaaaaa;
    local_118._14_2_ = 0xaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_120 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_130 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffeb0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)local_158);
    QStyleOption::operator=((QStyleOption *)local_158,&option->super_QStyleOption);
    stack0xfffffffffffffeb0 = (int *)((ulong)stack0xfffffffffffffeb0 | 0x800000);
    uVar26 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i;
    bVar16 = QItemSelectionModel::isSelected
                       ((QModelIndex *)
                        (this_00->super_QAbstractItemViewPrivate).selectionModel.wp.value);
    pQVar34 = QPalette::color(&(option->super_QStyleOption).palette,~uVar26 & Disabled,
                              (uint)bVar16 * 2 + Window);
    local_118.ct._4_6_ = (undefined6)((ulong)*(undefined8 *)((long)&pQVar34->ct + 2) >> 0x10);
    local_118._0_6_ = SUB86(*(undefined8 *)pQVar34,0);
    local_118.ct.argb.red = (ushort)((ulong)*(undefined8 *)pQVar34 >> 0x30);
    uVar26 = 0;
    if (option->showDecorationSelected == false) {
      iVar19 = QHeaderView::sectionPosition(this_01,0);
      iVar20 = QTreeViewPrivate::indentationForItem(this_00,this_00->current);
      uVar26 = iVar20 + iVar19;
    }
    iVar19 = QHeaderView::offset(this_01);
    iVar20 = QHeaderView::length(this_01);
    local_228.x2.m_i = ~uVar26 + (uVar26 - iVar19) + iVar20;
    local_228.x1.m_i = uVar26 - iVar19;
    local_228.y1.m_i = RVar18.m_i;
    local_228.y2.m_i = RVar24.m_i;
    QWidget::style((QWidget *)this);
    LVar28 = QWidget::layoutDirection((QWidget *)this);
    local_238 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                              super_QAbstractScrollAreaPrivate.viewport);
    local_148 = (undefined1  [16])QStyle::visualRect(LVar28,&local_238,&local_228);
    pQVar32 = QWidget::style((QWidget *)this);
    (**(code **)(*(long *)pQVar32 + 0xb0))(pQVar32,3,local_158,painter,0);
    if (((bVar2 != false) && (option->showDecorationSelected == false)) &&
       ((bVar17 = QHeaderView::sectionsMoved(this_01), bVar17 &&
        (iVar19 = QHeaderView::visualIndex(this_01,0), iVar19 != 0)))) {
      iVar19 = QHeaderView::sectionPosition(this_01,0);
      auVar6._4_4_ = iVar19 + -1;
      auVar6._0_4_ = RVar18.m_i;
      auVar6._8_4_ = RVar24.m_i;
      auVar6._12_4_ = 0;
      local_238 = (QRect)(auVar6 << 0x20);
      QWidget::style((QWidget *)this);
      LVar28 = QWidget::layoutDirection((QWidget *)this);
      local_248 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.viewport);
      local_148 = (undefined1  [16])QStyle::visualRect(LVar28,&local_248,&local_238);
      pQVar32 = QWidget::style((QWidget *)this);
      (**(code **)(*(long *)pQVar32 + 0xb0))(pQVar32,3,local_158,painter,0);
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_158);
  }
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::~QArrayDataPointer(&local_218);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_1f8);
  QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::drawRow(QPainter *painter, const QStyleOptionViewItem &option,
                        const QModelIndex &index) const
{
    Q_D(const QTreeView);
    QStyleOptionViewItem opt = option;
    const QPoint offset = d->scrollDelayOffset;
    const int y = option.rect.y() + offset.y();
    const QModelIndex parent = index.parent();
    const QHeaderView *header = d->header;
    const QModelIndex current = currentIndex();
    const QModelIndex hover = d->hover;
    const bool reverse = isRightToLeft();
    const QStyle::State state = opt.state;
    const bool spanning = d->spanning;
    const int left = (spanning ? header->visualIndex(0) : d->leftAndRight.first);
    const int right = (spanning ? header->visualIndex(0) : d->leftAndRight.second);
    const bool alternate = d->alternatingColors;
    const bool enabled = (state & QStyle::State_Enabled) != 0;
    const bool allColumnsShowFocus = d->allColumnsShowFocus;


    // when the row contains an index widget which has focus,
    // we want to paint the entire row as active
    bool indexWidgetHasFocus = false;
    if ((current.row() == index.row()) && !d->editorIndexHash.isEmpty()) {
        const int r = index.row();
        QWidget *fw = QApplication::focusWidget();
        for (int c = 0; c < header->count(); ++c) {
            QModelIndex idx = d->model->index(r, c, parent);
            if (QWidget *editor = indexWidget(idx)) {
                if (ancestorOf(editor, fw)) {
                    indexWidgetHasFocus = true;
                    break;
                }
            }
        }
    }

    const bool widgetHasFocus = hasFocus();
    bool currentRowHasFocus = false;
    if (allColumnsShowFocus && widgetHasFocus && current.isValid()) {
        // check if the focus index is before or after the visible columns
        const int r = index.row();
        for (int c = 0; c < left && !currentRowHasFocus; ++c) {
            QModelIndex idx = d->model->index(r, c, parent);
            currentRowHasFocus = (idx == current);
        }
        QModelIndex parent = d->model->parent(index);
        for (int c = right; c < header->count() && !currentRowHasFocus; ++c) {
            currentRowHasFocus = (d->model->index(r, c, parent) == current);
        }
    }

    // ### special case: if we select entire rows, then we need to draw the
    // selection in the first column all the way to the second column, rather
    // than just around the item text. We abuse showDecorationSelected to
    // indicate this to the style. Below we will reset this value temporarily
    // to only respect the styleHint while we are rendering the decoration.
    opt.showDecorationSelected = (d->selectionBehavior & SelectRows)
                                 || option.showDecorationSelected;

    int width, height = option.rect.height();
    int position;
    QModelIndex modelIndex;
    const bool hoverRow = selectionBehavior() == QAbstractItemView::SelectRows
                  && index.parent() == hover.parent()
                  && index.row() == hover.row();

    QList<int> logicalIndices;
    QList<QStyleOptionViewItem::ViewItemPosition>
            viewItemPosList; // vector of left/middle/end for each logicalIndex
    d->calcLogicalIndices(&logicalIndices, &viewItemPosList, left, right);

    for (int currentLogicalSection = 0; currentLogicalSection < logicalIndices.size(); ++currentLogicalSection) {
        int headerSection = logicalIndices.at(currentLogicalSection);
        position = columnViewportPosition(headerSection) + offset.x();
        width = header->sectionSize(headerSection);

        if (spanning) {
            int lastSection = header->logicalIndex(header->count() - 1);
            if (!reverse) {
                width = columnViewportPosition(lastSection) + header->sectionSize(lastSection) - position;
            } else {
                width += position - columnViewportPosition(lastSection);
                position = columnViewportPosition(lastSection);
            }
        }

        modelIndex = d->model->index(index.row(), headerSection, parent);
        if (!modelIndex.isValid())
            continue;
        opt.state = state;

        opt.viewItemPosition = viewItemPosList.at(currentLogicalSection);

        // fake activeness when row editor has focus
        if (indexWidgetHasFocus)
            opt.state |= QStyle::State_Active;

        if (d->selectionModel->isSelected(modelIndex))
            opt.state |= QStyle::State_Selected;
        if (widgetHasFocus && (current == modelIndex)) {
            if (allColumnsShowFocus)
                currentRowHasFocus = true;
            else
                opt.state |= QStyle::State_HasFocus;
        }
        opt.state.setFlag(QStyle::State_MouseOver,
                          (hoverRow || modelIndex == hover)
                          && (option.showDecorationSelected || d->hoverBranch == -1));

        if (enabled) {
            QPalette::ColorGroup cg;
            if ((d->model->flags(modelIndex) & Qt::ItemIsEnabled) == 0) {
                opt.state &= ~QStyle::State_Enabled;
                cg = QPalette::Disabled;
            } else if (opt.state & QStyle::State_Active) {
                cg = QPalette::Active;
            } else {
                cg = QPalette::Inactive;
            }
            opt.palette.setCurrentColorGroup(cg);
        }

        if (alternate) {
            opt.features.setFlag(QStyleOptionViewItem::Alternate, d->current & 1);
        }
        opt.features &= ~QStyleOptionViewItem::IsDecoratedRootColumn;

        /* Prior to Qt 4.3, the background of the branch (in selected state and
           alternate row color was provided by the view. For backward compatibility,
           this is now delegated to the style using PE_PanelItemViewRow which
           does the appropriate fill */
        if (d->isTreePosition(headerSection)) {
            const int i = d->indentationForItem(d->current);
            QRect branches(reverse ? position + width - i : position, y, i, height);
            const bool setClipRect = branches.width() > width;
            if (setClipRect) {
                painter->save();
                painter->setClipRect(QRect(position, y, width, height));
            }
            // draw background for the branch (selection + alternate row)

            // We use showDecorationSelected both to store the style hint, and to indicate
            // that the entire row has to be selected (see overrides of the value if
            // selectionBehavior == SelectRow).
            // While we are only painting the background we don't care for the
            // selectionBehavior factor, so respect only the style value, and reset later.
            const bool oldShowDecorationSelected = opt.showDecorationSelected;
            opt.showDecorationSelected = style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected,
                                                            &opt, this);
            opt.rect = branches;
            if (opt.rect.width() > 0) {
                // the root item also has a branch decoration
                opt.features |= QStyleOptionViewItem::IsDecoratedRootColumn;
                // we now want to draw the branch decoration
                opt.features |= QStyleOptionViewItem::IsDecorationForRootColumn;
                style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
                opt.features &= ~QStyleOptionViewItem::IsDecorationForRootColumn;
            }

            // draw background of the item (only alternate row). rest of the background
            // is provided by the delegate
            QStyle::State oldState = opt.state;
            opt.state &= ~QStyle::State_Selected;
            opt.rect.setRect(reverse ? position : i + position, y, width - i, height);
            style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
            opt.state = oldState;
            opt.showDecorationSelected = oldShowDecorationSelected;

            if (d->indent != 0)
                drawBranches(painter, branches, index);
            if (setClipRect)
                painter->restore();
        } else {
            QStyle::State oldState = opt.state;
            opt.state &= ~QStyle::State_Selected;
            opt.rect.setRect(position, y, width, height);
            style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
            opt.state = oldState;
        }

        itemDelegateForIndex(modelIndex)->paint(painter, opt, modelIndex);
    }

    if (currentRowHasFocus) {
        QStyleOptionFocusRect o;
        o.QStyleOption::operator=(option);
        o.state |= QStyle::State_KeyboardFocusChange;
        QPalette::ColorGroup cg = (option.state & QStyle::State_Enabled)
                                  ? QPalette::Normal : QPalette::Disabled;
        o.backgroundColor = option.palette.color(cg, d->selectionModel->isSelected(index)
                                                 ? QPalette::Highlight : QPalette::Window);
        int x = 0;
        if (!option.showDecorationSelected)
            x = header->sectionPosition(0) + d->indentationForItem(d->current);
        QRect focusRect(x - header->offset(), y, header->length() - x, height);
        o.rect = style()->visualRect(layoutDirection(), d->viewport->rect(), focusRect);
        style()->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter);
        // if we show focus on all columns and the first section is moved,
        // we have to split the focus rect into two rects
        if (allColumnsShowFocus && !option.showDecorationSelected
            && header->sectionsMoved() && (header->visualIndex(0) != 0)) {
            QRect sectionRect(0, y, header->sectionPosition(0), height);
            o.rect = style()->visualRect(layoutDirection(), d->viewport->rect(), sectionRect);
            style()->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter);
        }
    }
}